

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::attach_shader(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLuint local_24;
  GLuint local_20;
  GLuint notAProgram;
  GLuint notAShader;
  GLuint program;
  GLuint shader2;
  GLuint shader1;
  NegativeTestContext *ctx_local;
  
  _shader2 = ctx;
  program = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  notAShader = glu::CallLogWrapper::glCreateShader(&_shader2->super_CallLogWrapper,0x8b31);
  notAProgram = glu::CallLogWrapper::glCreateProgram(&_shader2->super_CallLogWrapper);
  local_20 = glu::CallLogWrapper::glCreateShader(&_shader2->super_CallLogWrapper,0x8b31);
  local_24 = glu::CallLogWrapper::glCreateProgram(&_shader2->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteShader(&_shader2->super_CallLogWrapper,local_20);
  glu::CallLogWrapper::glDeleteProgram(&_shader2->super_CallLogWrapper,local_24);
  pNVar1 = _shader2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_49);
  NegativeTestContext::beginSection(pNVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,program,program);
  NegativeTestContext::expectError(_shader2,0x502);
  NegativeTestContext::endSection(_shader2);
  pNVar1 = _shader2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_81);
  NegativeTestContext::beginSection(pNVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,notAProgram,notAProgram);
  NegativeTestContext::expectError(_shader2,0x502);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,program,notAProgram);
  NegativeTestContext::expectError(_shader2,0x502);
  NegativeTestContext::endSection(_shader2);
  pNVar1 = _shader2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL."
             ,&local_a9);
  NegativeTestContext::beginSection(pNVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,notAProgram,local_20);
  NegativeTestContext::expectError(_shader2,0x501);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,local_24,program);
  NegativeTestContext::expectError(_shader2,0x501);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,local_24,local_20);
  NegativeTestContext::expectError(_shader2,0x501);
  NegativeTestContext::endSection(_shader2);
  pNVar1 = _shader2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "GL_INVALID_OPERATION is generated if shader is already attached to program.",&local_d1
            );
  NegativeTestContext::beginSection(pNVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,notAProgram,program);
  NegativeTestContext::expectError(_shader2,0);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,notAProgram,program);
  NegativeTestContext::expectError(_shader2,0x502);
  NegativeTestContext::endSection(_shader2);
  pNVar1 = _shader2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "GL_INVALID_OPERATION is generated if a shader of the same type as shader is already attached to program."
             ,&local_f9);
  NegativeTestContext::beginSection(pNVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  glu::CallLogWrapper::glAttachShader(&_shader2->super_CallLogWrapper,notAProgram,notAShader);
  NegativeTestContext::expectError(_shader2,0x502);
  NegativeTestContext::endSection(_shader2);
  glu::CallLogWrapper::glDeleteProgram(&_shader2->super_CallLogWrapper,notAProgram);
  glu::CallLogWrapper::glDeleteShader(&_shader2->super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&_shader2->super_CallLogWrapper,notAShader);
  return;
}

Assistant:

void attach_shader (NegativeTestContext& ctx)
{
	GLuint shader1 = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint shader2 = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint program = ctx.glCreateProgram();

	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	const GLuint notAProgram = ctx.glCreateProgram();

	ctx.glDeleteShader(notAShader);
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glAttachShader(shader1, shader1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glAttachShader(program, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glAttachShader(shader1, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL.");
	ctx.glAttachShader(program, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glAttachShader(notAProgram, shader1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glAttachShader(notAProgram, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is already attached to program.");
	ctx.glAttachShader(program, shader1);
	ctx.expectError(GL_NO_ERROR);
	ctx.glAttachShader(program, shader1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a shader of the same type as shader is already attached to program.");
	ctx.glAttachShader(program, shader2);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader1);
	ctx.glDeleteShader(shader2);
}